

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

void __thiscall BVSparse<Memory::JitArenaAllocator>::Dump(BVSparse<Memory::JitArenaAllocator> *this)

{
  Type_conflict local_20;
  BVSparseNode *node;
  bool hasBits;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  node._7_1_ = false;
  Output::Print(L"[ ");
  for (local_20 = this->head; local_20 != (Type_conflict)0x0; local_20 = local_20->next) {
    node._7_1_ = BVUnitT<unsigned_long>::Dump(&local_20->data,local_20->startIndex,node._7_1_);
  }
  Output::Print(L"]\n");
  return;
}

Assistant:

void
BVSparse<TAllocator>::Dump() const
{
    bool hasBits = false;
    Output::Print(_u("[ "));
    for(BVSparseNode * node = this->head; node != 0 ; node = node->next)
    {
        hasBits = node->data.Dump(node->startIndex, hasBits);
    }
    Output::Print(_u("]\n"));
}